

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChForce.cpp
# Opt level: O1

void __thiscall chrono::ChForce::ArchiveIN(ChForce *this,ChArchiveIn *marchive)

{
  _func_int **pp_Var1;
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  AlignmentFrame_mapper alignmapper;
  ReferenceFrame_mapper refmapper;
  ForceType_mapper ftypemapper;
  ChEnumMapper<chrono::ChForce::AlignmentFrame> local_d0;
  shared_ptr<chrono::ChFunction> local_b0;
  undefined1 local_a0;
  ChEnumMapper<chrono::ChForce::ReferenceFrame> local_98;
  ChEnumMapper<chrono::ChForce::ForceType> local_78;
  _func_int **local_58;
  ForceType_mapper local_50;
  
  ChArchiveIn::VersionRead<chrono::ChForce>(marchive);
  ChObj::ArchiveIN(&this->super_ChObj,marchive);
  ForceType_mapper::ForceType_mapper(&local_50);
  ForceType_mapper::operator()(&local_78,&local_50,&this->mode);
  local_98.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981a70;
  local_98.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_98.value_ptr = (ReferenceFrame *)&local_78;
  (**(code **)(*(long *)marchive + 0x58))(marchive);
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b2b910
  ;
  if (local_78.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ForceType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ForceType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ForceType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ForceType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  ReferenceFrame_mapper::ReferenceFrame_mapper((ReferenceFrame_mapper *)&local_78);
  ReferenceFrame_mapper::operator()(&local_98,(ReferenceFrame_mapper *)&local_78,&this->frame);
  local_d0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981a7b;
  local_d0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_d0.value_ptr = (AlignmentFrame *)&local_98;
  (**(code **)(*(long *)marchive + 0x58))(marchive);
  local_98.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b2ba10
  ;
  if (local_98.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  AlignmentFrame_mapper::AlignmentFrame_mapper((AlignmentFrame_mapper *)&local_98);
  AlignmentFrame_mapper::operator()(&local_d0,(AlignmentFrame_mapper *)&local_98,&this->align);
  local_b0.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x981a90;
  local_a0 = 0;
  local_b0.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_d0;
  (**(code **)(*(long *)marchive + 0x58))(marchive,&local_b0);
  local_58 = (_func_int **)&PTR_GetValueAsInt_00b2b910;
  local_d0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b2bb10
  ;
  if (local_d0.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_b0.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->vrelpoint;
  local_b0.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__ChFunctorArchiveIn_00b2ade0;
  local_d0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981aa5;
  local_d0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_d0.value_ptr = (AlignmentFrame *)&local_b0;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  local_b0.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->vpoint;
  local_b0.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__ChFunctorArchiveIn_00b2ade0;
  local_d0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981aaf;
  local_d0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_d0.value_ptr = (AlignmentFrame *)&local_b0;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  local_d0.value_ptr = (AlignmentFrame *)&this->move_x;
  local_d0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981ab6;
  local_d0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_d0);
  local_d0.value_ptr = (AlignmentFrame *)&this->move_y;
  local_d0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981abd;
  local_d0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_d0);
  local_d0.value_ptr = (AlignmentFrame *)&this->move_z;
  local_d0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981ac4;
  local_d0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_d0);
  local_b0.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->restpos;
  local_b0.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__ChFunctorArchiveIn_00b2ade0;
  local_d0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981acb;
  local_d0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_d0.value_ptr = (AlignmentFrame *)&local_b0;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  local_d0.value_ptr = (AlignmentFrame *)&this->f_x;
  local_d0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981ad3;
  local_d0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_d0);
  local_d0.value_ptr = (AlignmentFrame *)&this->f_y;
  local_d0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981ad7;
  local_d0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_d0);
  local_d0.value_ptr = (AlignmentFrame *)&this->f_z;
  local_d0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981adb;
  local_d0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_d0);
  local_d0.value_ptr = (AlignmentFrame *)&this->mforce;
  local_d0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981adf;
  local_d0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_d0.value_ptr = (AlignmentFrame *)&this->modula;
  local_d0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981ae6;
  local_d0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_d0);
  local_b0.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->vreldir;
  local_b0.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__ChFunctorArchiveIn_00b2ade0;
  local_d0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981aed;
  local_d0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_d0.value_ptr = (AlignmentFrame *)&local_b0;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  local_b0.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->vdir;
  local_b0.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__ChFunctorArchiveIn_00b2ade0;
  local_d0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981af5;
  local_d0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_d0.value_ptr = (AlignmentFrame *)&local_b0;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  pp_Var1 = local_58;
  local_98.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b2bb10
  ;
  if (local_98.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b2ba10
  ;
  if (local_78.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ForceType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ForceType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ForceType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ForceType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_50.super_ChEnumMapper<chrono::ChForce::ForceType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = pp_Var1;
  if (local_50.super_ChEnumMapper<chrono::ChForce::ForceType>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ForceType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ForceType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super_ChEnumMapper<chrono::ChForce::ForceType>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ForceType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ForceType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChForce::ArchiveIN(ChArchiveIn& marchive) {
    // class version number
    /*int version =*/ marchive.VersionRead<ChForce>();

    // deserialize parent class too
    ChObj::ArchiveIN(marchive);

    // stream in all member data

    ForceType_mapper ftypemapper;
    marchive >> CHNVP(ftypemapper(mode), "force_type");
    ReferenceFrame_mapper refmapper;
    marchive >> CHNVP(refmapper(frame), "reference_frame_type");
    AlignmentFrame_mapper alignmapper;
    marchive >> CHNVP(alignmapper(align), "alignment_frame_type");

    marchive >> CHNVP(vrelpoint);
    marchive >> CHNVP(vpoint);
    marchive >> CHNVP(move_x);
    marchive >> CHNVP(move_y);
    marchive >> CHNVP(move_z);
    marchive >> CHNVP(restpos);
    marchive >> CHNVP(f_x);
    marchive >> CHNVP(f_y);
    marchive >> CHNVP(f_z);
    marchive >> CHNVP(mforce);
    marchive >> CHNVP(modula, "f_time");
    marchive >> CHNVP(vreldir);
    marchive >> CHNVP(vdir);
}